

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O2

void __thiscall fizplex::Base::apply_etm(Base *this,ETM *etm,SVector *vec)

{
  double dVar1;
  pointer pNVar2;
  size_t sVar3;
  Nonzero *v;
  pointer pNVar4;
  double *pdVar5;
  SVector *__range1;
  bool bVar6;
  Nonzero *e;
  DVector *this_00;
  double local_38;
  
  pNVar4 = (vec->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (vec->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar3 = etm->col;
  local_38 = 0.0;
  bVar6 = false;
  for (; pNVar4 != pNVar2; pNVar4 = pNVar4 + 1) {
    if (pNVar4->index == sVar3) {
      local_38 = pNVar4->value;
      pNVar4->value = 0.0;
      bVar6 = true;
    }
  }
  if (bVar6) {
    this_00 = &this->work;
    for (pNVar4 = (etm->eta).values.
                  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pNVar4 != (etm->eta).values.
                  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pNVar4 = pNVar4 + 1) {
      dVar1 = pNVar4->value;
      pdVar5 = DVector::operator[](this_00,pNVar4->index);
      *pdVar5 = dVar1;
    }
    pNVar2 = (vec->values).
             super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pNVar4 = (vec->values).
                  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                  ._M_impl.super__Vector_impl_data._M_start; pNVar4 != pNVar2; pNVar4 = pNVar4 + 1)
    {
      pdVar5 = DVector::operator[](this_00,pNVar4->index);
      if (0.0 < *pdVar5) {
LAB_00176fe6:
        pdVar5 = DVector::operator[](this_00,pNVar4->index);
        pNVar4->value = *pdVar5 * local_38 + pNVar4->value;
        pdVar5 = DVector::operator[](this_00,pNVar4->index);
        *pdVar5 = 0.0;
      }
      else {
        pdVar5 = DVector::operator[](this_00,pNVar4->index);
        if (*pdVar5 <= 0.0 && *pdVar5 != 0.0) goto LAB_00176fe6;
      }
    }
    for (pNVar4 = (etm->eta).values.
                  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pNVar4 != (etm->eta).values.
                  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pNVar4 = pNVar4 + 1) {
      pdVar5 = DVector::operator[](this_00,pNVar4->index);
      if (0.0 < *pdVar5) {
LAB_00177058:
        sVar3 = pNVar4->index;
        pdVar5 = DVector::operator[](this_00,sVar3);
        SVector::add_value(vec,sVar3,*pdVar5 * local_38);
        pdVar5 = DVector::operator[](this_00,pNVar4->index);
        *pdVar5 = 0.0;
      }
      else {
        pdVar5 = DVector::operator[](this_00,pNVar4->index);
        if (*pdVar5 <= 0.0 && *pdVar5 != 0.0) goto LAB_00177058;
      }
    }
  }
  return;
}

Assistant:

void Base::apply_etm(const ETM &etm, SVector &vec) {
  double mult = 0.0;
  bool found = false;
  // Find nonzero multiplier in vec_i
  for (auto &v : vec) {
    if (v.index == etm.col) {
      found = true;
      mult = v.value;
      v.value =
          0.0; // otherwise v_col = v_col + v_col * mult; should be v_col =
               // v_col * mult
    }
  }
  if (found) {
    for (auto it = etm.eta.cbegin(); it != etm.eta.cend(); ++it)
      work[it->index] = it->value;
    for (auto &e : vec) {
      if (work[e.index] > 0.0 or work[e.index] < 0.0) {
        e.value += work[e.index] * mult;
        work[e.index] = 0.0;
      }
    }
    for (auto it = etm.eta.cbegin(); it != etm.eta.cend(); ++it) {
      if (work[it->index] > 0.0 or work[it->index] < 0.0) {
        vec.add_value(it->index, work[it->index] * mult);
        work[it->index] = 0.0;
      }
    }
  }
}